

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber * uprv_decNumberLog10_63(decNumber *res,decNumber *rhs,decContext *set)

{
  decNumber *pdVar1;
  uint32_t uVar2;
  uint local_130;
  uint local_12c;
  int local_128;
  uint32_t local_124 [2];
  uint32_t copystat;
  int32_t residue;
  decContext aset;
  decNumber *w;
  decNumber bufw [2];
  decNumber *local_d8;
  decNumber *b;
  decNumber *allocbufb;
  decNumber bufb [5];
  decNumber *a;
  decNumber *allocbufa;
  decNumber bufa [5];
  int32_t t;
  int32_t p;
  uint32_t needbytes;
  uint32_t ignore;
  uint32_t status;
  decContext *set_local;
  decNumber *rhs_local;
  decNumber *res_local;
  
  needbytes = 0;
  p = 0;
  a = (decNumber *)0x0;
  unique0x00004780 = (decNumber *)&allocbufa;
  b = (decNumber *)0x0;
  local_d8 = (decNumber *)&allocbufb;
  aset._20_8_ = &w;
  _ignore = set;
  set_local = (decContext *)rhs;
  rhs_local = res;
  uVar2 = decCheckMath(rhs,set,&needbytes);
  if (uVar2 == 0) {
    uprv_decContextDefault_63((decContext *)&copystat,0x40);
    if (((set_local->emin & 0xf0) == 0) &&
       (((*(char *)((long)&set_local->emin + 1) != '\0' || (set_local->digits != 1)) ||
        ((set_local->emin & 0x70) != 0)))) {
      local_124[1] = 0;
      local_124[0] = 0;
      copystat = 1;
      decCopyFit((decNumber *)aset._20_8_,(decNumber *)set_local,(decContext *)&copystat,
                 (int32_t *)(local_124 + 1),local_124);
      if (((local_124[0] & 0x20) == 0) && (*(char *)(aset._20_8_ + 9) == '\x01')) {
        uprv_decNumberFromInt32_63((decNumber *)aset._20_8_,*(int32_t *)(aset._20_8_ + 4));
        local_124[1] = 0;
        decCopyFit(rhs_local,(decNumber *)aset._20_8_,_ignore,(int32_t *)(local_124 + 1),&needbytes)
        ;
        decFinalize(rhs_local,_ignore,(int32_t *)(local_124 + 1),&needbytes);
        goto LAB_002c2ad9;
      }
    }
    if (_ignore->digits < set_local->digits + 6) {
      local_128 = set_local->digits + 6;
    }
    else {
      local_128 = _ignore->digits;
    }
    uVar2 = local_128 + 3;
    if ((int)uVar2 < 0x32) {
      local_12c = (uint)""[(int)uVar2];
    }
    else {
      local_12c = (int)uVar2 / 1;
    }
    pdVar1 = stack0xffffffffffffff78;
    if ((local_12c + 0xb < 0x3d) ||
       (a = (decNumber *)uprv_malloc_63((ulong)(local_12c + 0xb)), pdVar1 = a, a != (decNumber *)0x0
       )) {
      stack0xffffffffffffff78 = pdVar1;
      residue = 999999;
      aset.digits = -999999;
      aset.traps._0_1_ = 0;
      copystat = uVar2;
      decLnOp(stack0xffffffffffffff78,(decNumber *)set_local,(decContext *)&copystat,&needbytes);
      if (((needbytes & 0xdd) == 0) || ((needbytes & 0x40000000) != 0)) {
        if (((stack0xffffffffffffff78->bits & 0x70) == 0) &&
           (((stack0xffffffffffffff78->lsu[0] != '\0' || (stack0xffffffffffffff78->digits != 1)) ||
            ((stack0xffffffffffffff78->bits & 0x70) != 0)))) {
          uVar2 = _ignore->digits + 3;
          if ((int)uVar2 < 0x32) {
            local_130 = (uint)""[(int)uVar2];
          }
          else {
            local_130 = (int)uVar2 / 1;
          }
          if ((local_130 + 0xb < 0x3d) ||
             (local_d8 = (decNumber *)uprv_malloc_63((ulong)(local_130 + 0xb)), b = local_d8,
             local_d8 != (decNumber *)0x0)) {
            uprv_decNumberZero_63((decNumber *)aset._20_8_);
            *(undefined1 *)(aset._20_8_ + 10) = 1;
            *(undefined1 *)(aset._20_8_ + 9) = 0;
            *(undefined4 *)aset._20_8_ = 2;
            copystat = uVar2;
            decLnOp(local_d8,(decNumber *)aset._20_8_,(decContext *)&copystat,(uint32_t *)&p);
            copystat = _ignore->digits;
            decDivideOp(rhs_local,stack0xffffffffffffff78,local_d8,(decContext *)&copystat,0x80,
                        &needbytes);
          }
          else {
            needbytes = needbytes | 0x10;
          }
        }
        else {
          uprv_decNumberCopy_63(rhs_local,stack0xffffffffffffff78);
        }
      }
    }
    else {
      needbytes = needbytes | 0x10;
    }
  }
LAB_002c2ad9:
  if (a != (decNumber *)0x0) {
    uprv_free_63(a);
  }
  if (b != (decNumber *)0x0) {
    uprv_free_63(b);
  }
  if (needbytes != 0) {
    decStatus(rhs_local,needbytes,_ignore);
  }
  return rhs_local;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberLog10(decNumber *res, const decNumber *rhs,
                          decContext *set) {
  uInt status=0, ignore=0;         /* status accumulators  */
  uInt needbytes;                  /* for space calculations  */
  Int p;                           /* working precision  */
  Int t;                           /* digits in exponent of A  */

  /* buffers for a and b working decimals  */
  /* (adjustment calculator, same size)  */
  decNumber bufa[D2N(DECBUFFER+2)];
  decNumber *allocbufa=NULL;       /* -> allocated bufa, iff allocated  */
  decNumber *a=bufa;               /* temporary a  */
  decNumber bufb[D2N(DECBUFFER+2)];
  decNumber *allocbufb=NULL;       /* -> allocated bufb, iff allocated  */
  decNumber *b=bufb;               /* temporary b  */
  decNumber bufw[D2N(10)];         /* working 2-10 digit number  */
  decNumber *w=bufw;               /* ..  */
  #if DECSUBSET
  decNumber *allocrhs=NULL;        /* non-NULL if rounded rhs allocated  */
  #endif

  decContext aset;                 /* working context  */

  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  /* Check restrictions; this is a math function; if not violated  */
  /* then carry out the operation.  */
  if (!decCheckMath(rhs, set, &status)) do { /* protect malloc  */
    #if DECSUBSET
    if (!set->extended) {
      /* reduce operand and set lostDigits status, as needed  */
      if (rhs->digits>set->digits) {
        allocrhs=decRoundOperand(rhs, set, &status);
        if (allocrhs==NULL) break;
        rhs=allocrhs;
        }
      /* special check in subset for rhs=0  */
      if (ISZERO(rhs)) {                /* +/- zeros -> error  */
        status|=DEC_Invalid_operation;
        break;}
      } /* extended=0  */
    #endif

    uprv_decContextDefault(&aset, DEC_INIT_DECIMAL64); /* clean context  */

    /* handle exact powers of 10; only check if +ve finite  */
    if (!(rhs->bits&(DECNEG|DECSPECIAL)) && !ISZERO(rhs)) {
      Int residue=0;               /* (no residue)  */
      uInt copystat=0;             /* clean status  */

      /* round to a single digit...  */
      aset.digits=1;
      decCopyFit(w, rhs, &aset, &residue, &copystat); /* copy & shorten  */
      /* if exact and the digit is 1, rhs is a power of 10  */
      if (!(copystat&DEC_Inexact) && w->lsu[0]==1) {
        /* the exponent, conveniently, is the power of 10; making  */
        /* this the result needs a little care as it might not fit,  */
        /* so first convert it into the working number, and then move  */
        /* to res  */
        uprv_decNumberFromInt32(w, w->exponent);
        residue=0;
        decCopyFit(res, w, set, &residue, &status); /* copy & round  */
        decFinish(res, set, &residue, &status);     /* cleanup/set flags  */
        break;
        } /* not a power of 10  */
      } /* not a candidate for exact  */

    /* simplify the information-content calculation to use 'total  */
    /* number of digits in a, including exponent' as compared to the  */
    /* requested digits, as increasing this will only rarely cost an  */
    /* iteration in ln(a) anyway  */
    t=6;                                /* it can never be >6  */

    /* allocate space when needed...  */
    p=(rhs->digits+t>set->digits?rhs->digits+t:set->digits)+3;
    needbytes=sizeof(decNumber)+(D2U(p)-1)*sizeof(Unit);
    if (needbytes>sizeof(bufa)) {       /* need malloc space  */
      allocbufa=(decNumber *)malloc(needbytes);
      if (allocbufa==NULL) {            /* hopeless -- abandon  */
        status|=DEC_Insufficient_storage;
        break;}
      a=allocbufa;                      /* use the allocated space  */
      }
    aset.digits=p;                      /* as calculated  */
    aset.emax=DEC_MAX_MATH;             /* usual bounds  */
    aset.emin=-DEC_MAX_MATH;            /* ..  */
    aset.clamp=0;                       /* and no concrete format  */
    decLnOp(a, rhs, &aset, &status);    /* a=ln(rhs)  */

    /* skip the division if the result so far is infinite, NaN, or  */
    /* zero, or there was an error; note NaN from sNaN needs copy  */
    if (status&DEC_NaNs && !(status&DEC_sNaN)) break;
    if (a->bits&DECSPECIAL || ISZERO(a)) {
      uprv_decNumberCopy(res, a);            /* [will fit]  */
      break;}

    /* for ln(10) an extra 3 digits of precision are needed  */
    p=set->digits+3;
    needbytes=sizeof(decNumber)+(D2U(p)-1)*sizeof(Unit);
    if (needbytes>sizeof(bufb)) {       /* need malloc space  */
      allocbufb=(decNumber *)malloc(needbytes);
      if (allocbufb==NULL) {            /* hopeless -- abandon  */
        status|=DEC_Insufficient_storage;
        break;}
      b=allocbufb;                      /* use the allocated space  */
      }
    uprv_decNumberZero(w);                   /* set up 10...  */
    #if DECDPUN==1
    w->lsu[1]=1; w->lsu[0]=0;           /* ..  */
    #else
    w->lsu[0]=10;                       /* ..  */
    #endif
    w->digits=2;                        /* ..  */

    aset.digits=p;
    decLnOp(b, w, &aset, &ignore);      /* b=ln(10)  */

    aset.digits=set->digits;            /* for final divide  */
    decDivideOp(res, a, b, &aset, DIVIDE, &status); /* into result  */
    } while(0);                         /* [for break]  */

  if (allocbufa!=NULL) free(allocbufa); /* drop any storage used  */
  if (allocbufb!=NULL) free(allocbufb); /* ..  */
  #if DECSUBSET
  if (allocrhs !=NULL) free(allocrhs);  /* ..  */
  #endif
  /* apply significant status  */
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }